

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O3

void write_header(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,int num_colors)

{
  jpeg_error_mgr *pjVar1;
  size_t sVar2;
  char targaheader [18];
  undefined8 local_28;
  long lStack_20;
  undefined2 local_18;
  
  local_28 = 0;
  if (0 < num_colors) {
    local_28 = CONCAT17(0x18,CONCAT16((char)((uint)num_colors >> 8),CONCAT15((char)num_colors,0x100)
                                     ));
  }
  lStack_20 = (ulong)CONCAT13((char)(cinfo->output_height >> 8),
                              CONCAT12((char)cinfo->output_height,(short)cinfo->output_width)) <<
              0x20;
  if (cinfo->out_color_space == JCS_GRAYSCALE) {
    local_28._0_3_ = CONCAT12(3,(undefined2)local_28);
  }
  else {
    if (num_colors < 1) {
      local_28._0_3_ = CONCAT12(2,(undefined2)local_28);
      local_18 = 0x2018;
      goto LAB_0010625b;
    }
    local_28._0_3_ = CONCAT12(1,(undefined2)local_28);
  }
  local_18 = 0x2008;
LAB_0010625b:
  sVar2 = fwrite(&local_28,1,0x12,(FILE *)dinfo->output_file);
  if (sVar2 == 0x12) {
    return;
  }
  pjVar1 = cinfo->err;
  pjVar1->msg_code = 0x25;
  (*pjVar1->error_exit)((j_common_ptr)cinfo);
  return;
}

Assistant:

LOCAL(void)
write_header(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo, int num_colors)
/* Create and write a Targa header */
{
  char targaheader[18];

  /* Set unused fields of header to 0 */
  MEMZERO(targaheader, sizeof(targaheader));

  if (num_colors > 0) {
    targaheader[1] = 1;         /* color map type 1 */
    targaheader[5] = (char)(num_colors & 0xFF);
    targaheader[6] = (char)(num_colors >> 8);
    targaheader[7] = 24;        /* 24 bits per cmap entry */
  }

  targaheader[12] = (char)(cinfo->output_width & 0xFF);
  targaheader[13] = (char)(cinfo->output_width >> 8);
  targaheader[14] = (char)(cinfo->output_height & 0xFF);
  targaheader[15] = (char)(cinfo->output_height >> 8);
  targaheader[17] = 0x20;       /* Top-down, non-interlaced */

  if (cinfo->out_color_space == JCS_GRAYSCALE) {
    targaheader[2] = 3;         /* image type = uncompressed grayscale */
    targaheader[16] = 8;        /* bits per pixel */
  } else {                      /* must be RGB */
    if (num_colors > 0) {
      targaheader[2] = 1;       /* image type = colormapped RGB */
      targaheader[16] = 8;
    } else {
      targaheader[2] = 2;       /* image type = uncompressed RGB */
      targaheader[16] = 24;
    }
  }

  if (JFWRITE(dinfo->output_file, targaheader, 18) != (size_t)18)
    ERREXIT(cinfo, JERR_FILE_WRITE);
}